

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_uwsgi_module.c
# Opt level: O0

char * ngx_http_uwsgi_cache(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  int iVar1;
  ngx_int_t nVar2;
  void *pvVar3;
  ngx_shm_zone_t *pnVar4;
  undefined1 local_80 [8];
  ngx_http_compile_complex_value_t ccv;
  ngx_http_complex_value_t cv;
  ngx_str_t *value;
  ngx_http_uwsgi_loc_conf_t *uwcf;
  void *conf_local;
  ngx_command_t *cmd_local;
  ngx_conf_t *cf_local;
  
  pvVar3 = cf->args->elts;
  if ((char)(*(char *)((long)conf + 0x1a0) << 6) >> 6 == -1) {
    iVar1 = strcmp(*(char **)((long)pvVar3 + 0x18),"off");
    if (iVar1 == 0) {
      *(byte *)((long)conf + 0x1a0) = *(byte *)((long)conf + 0x1a0) & 0xfc;
      cf_local = (ngx_conf_t *)0x0;
    }
    else if ((char)(*(char *)((long)conf + 0x1a0) << 4) >> 6 < '\x01') {
      *(byte *)((long)conf + 0x1a0) = *(byte *)((long)conf + 0x1a0) & 0xfc | 1;
      memset(local_80,0,0x20);
      ccv.cf = (ngx_conf_t *)((long)pvVar3 + 0x10);
      ccv.value = (ngx_str_t *)&ccv.field_0x18;
      local_80 = (undefined1  [8])cf;
      nVar2 = ngx_http_compile_complex_value((ngx_http_compile_complex_value_t *)local_80);
      if (nVar2 == 0) {
        if (cv.flushes == (ngx_uint_t *)0x0) {
          pnVar4 = ngx_shared_memory_add
                             (cf,(ngx_str_t *)((long)pvVar3 + 0x10),0,&ngx_http_uwsgi_module);
          *(ngx_shm_zone_t **)((long)conf + 0x110) = pnVar4;
          if (*(long *)((long)conf + 0x110) == 0) {
            cf_local = (ngx_conf_t *)0xffffffffffffffff;
          }
          else {
            cf_local = (ngx_conf_t *)0x0;
          }
        }
        else {
          pvVar3 = ngx_palloc(cf->pool,0x28);
          *(void **)((long)conf + 0x118) = pvVar3;
          if (*(long *)((long)conf + 0x118) == 0) {
            cf_local = (ngx_conf_t *)0xffffffffffffffff;
          }
          else {
            memcpy(*(void **)((long)conf + 0x118),&ccv.field_0x18,0x28);
            cf_local = (ngx_conf_t *)0x0;
          }
        }
      }
      else {
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
    }
    else {
      cf_local = (ngx_conf_t *)anon_var_dwarf_ee678;
    }
  }
  else {
    cf_local = (ngx_conf_t *)anon_var_dwarf_1243;
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_http_uwsgi_cache(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_uwsgi_loc_conf_t *uwcf = conf;

    ngx_str_t                         *value;
    ngx_http_complex_value_t           cv;
    ngx_http_compile_complex_value_t   ccv;

    value = cf->args->elts;

    if (uwcf->upstream.cache != NGX_CONF_UNSET) {
        return "is duplicate";
    }

    if (ngx_strcmp(value[1].data, "off") == 0) {
        uwcf->upstream.cache = 0;
        return NGX_CONF_OK;
    }

    if (uwcf->upstream.store > 0) {
        return "is incompatible with \"uwsgi_store\"";
    }

    uwcf->upstream.cache = 1;

    ngx_memzero(&ccv, sizeof(ngx_http_compile_complex_value_t));

    ccv.cf = cf;
    ccv.value = &value[1];
    ccv.complex_value = &cv;

    if (ngx_http_compile_complex_value(&ccv) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    if (cv.lengths != NULL) {

        uwcf->upstream.cache_value = ngx_palloc(cf->pool,
                                             sizeof(ngx_http_complex_value_t));
        if (uwcf->upstream.cache_value == NULL) {
            return NGX_CONF_ERROR;
        }

        *uwcf->upstream.cache_value = cv;

        return NGX_CONF_OK;
    }

    uwcf->upstream.cache_zone = ngx_shared_memory_add(cf, &value[1], 0,
                                                      &ngx_http_uwsgi_module);
    if (uwcf->upstream.cache_zone == NULL) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}